

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

int STRING_copy(STRING_HANDLE handle,char *s2)

{
  size_t sVar1;
  char *pcVar2;
  LOGGER_LOG p_Var3;
  size_t local_50;
  LOGGER_LOG l;
  char *temp;
  size_t realloc_size;
  size_t s2Length;
  STRING *s1;
  int result;
  char *s2_local;
  STRING_HANDLE handle_local;
  
  if ((handle == (STRING_HANDLE)0x0) || (s2 == (char *)0x0)) {
    s1._4_4_ = 0x1e2;
  }
  else if (handle->s == s2) {
    s1._4_4_ = 0;
  }
  else {
    sVar1 = strlen(s2);
    if (sVar1 < 0xfffffffffffffffe) {
      local_50 = sVar1 + 1;
    }
    else {
      local_50 = 0xffffffffffffffff;
    }
    if ((local_50 == 0xffffffffffffffff) ||
       (pcVar2 = (char *)realloc(handle->s,local_50), pcVar2 == (char *)0x0)) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                  ,"STRING_copy",0x1f0,1,"Failure reallocating value. size=%zu",local_50);
      }
      s1._4_4_ = 0x1f2;
    }
    else {
      handle->s = pcVar2;
      memmove(handle->s,s2,sVar1 + 1);
      s1._4_4_ = 0;
    }
  }
  return s1._4_4_;
}

Assistant:

int STRING_copy(STRING_HANDLE handle, const char* s2)
{
    int result;
    if ((handle == NULL) || (s2 == NULL))
    {
        /* Codes_SRS_STRING_07_017: [STRING_copy shall return a nonzero value if any of the supplied parameters are NULL.] */
        result = MU_FAILURE;
    }
    else
    {
        STRING* s1 = (STRING*)handle;
        /* Codes_SRS_STRING_07_026: [If the underlying char* refered to by s1 handle is equal to char* s2 than STRING_copy shall be a noop and return 0.] */
        if (s1->s != s2)
        {
            size_t s2Length = strlen(s2);
            size_t realloc_size = safe_add_size_t(s2Length, 1);
            char* temp;
            if (realloc_size == SIZE_MAX ||
                (temp = (char*)realloc(s1->s, realloc_size)) == NULL)
            {
                LogError("Failure reallocating value. size=%zu", realloc_size);
                /* Codes_SRS_STRING_07_027: [STRING_copy shall return a nonzero value if any error is encountered.] */
                result = MU_FAILURE;
            }
            else
            {
                s1->s = temp;
                memmove(s1->s, s2, s2Length + 1);
                result = 0;
            }
        }
        else
        {
            /* Codes_SRS_STRING_07_033: [If overlapping pointer address is given to STRING_copy the behavior is undefined.] */
            result = 0;
        }
    }
    return result;
}